

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationCommonEdgeTests.cpp
# Opt level: O1

TestCaseGroup * vkt::tessellation::createCommonEdgeTests(TestContext *testCtx)

{
  ShaderType SVar1;
  TestContext *testCtx_00;
  size_t sVar2;
  TestNode *node;
  int iVar3;
  long lVar4;
  pointer pcVar5;
  char *pcVar6;
  bool bVar7;
  undefined1 auStack_1f8 [8];
  TestNode *local_1f0;
  ulong local_1e8;
  long local_1e0;
  char *local_1d8;
  long local_1d0;
  long *local_1c8;
  long local_1b8 [2];
  long *local_1a8 [2];
  long local_198 [12];
  ios_base local_138 [264];
  
  local_1f0 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_1f0,testCtx,"common_edge",
             "Draw multiple adjacent shapes and check that no cracks appear between them");
  lVar4 = 0;
  do {
    SVar1 = createCommonEdgeTests(tcu::TestContext&)::primitiveTypes[lVar4];
    local_1e8 = 0;
    local_1e0 = lVar4;
    do {
      bVar7 = (int)local_1e8 == 1;
      local_1d8 = "";
      if (bVar7) {
        local_1d8 = "_precise";
      }
      local_1d0 = (ulong)bVar7 << 3;
      lVar4 = 0;
      pcVar5 = (pointer)(ulong)SVar1;
      do {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        if ((pointer)(ulong)SVar1 == (pointer)0x0) {
          bVar7 = false;
          pcVar6 = "triangles";
        }
        else if (SVar1 == SHADERTYPE_GEOMETRY) {
          bVar7 = false;
          pcVar6 = "isolines";
        }
        else if (SVar1 == SHADERTYPE_FRAGMENT) {
          bVar7 = false;
          pcVar6 = "quads";
        }
        else {
          bVar7 = true;
          pcVar6 = (char *)0x0;
        }
        if (bVar7) {
          std::ios::clear((int)auStack_1f8 + (int)local_1a8[0][-3] + 0x50);
        }
        else {
          sVar2 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar2);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_",1);
        iVar3 = (int)lVar4;
        if (iVar3 == 0) {
          bVar7 = false;
          pcVar6 = "equal_spacing";
        }
        else if (iVar3 == 2) {
          bVar7 = false;
          pcVar6 = "fractional_even_spacing";
        }
        else if (iVar3 == 1) {
          bVar7 = false;
          pcVar6 = "fractional_odd_spacing";
        }
        else {
          bVar7 = true;
          pcVar6 = (char *)0x0;
        }
        if (bVar7) {
          std::ios::clear((int)auStack_1f8 + (int)local_1a8[0][-3] + 0x50);
        }
        else {
          sVar2 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar2);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_1d8,local_1d0)
        ;
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        local_1a8[0] = local_198;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"");
        testCtx_00 = local_1f0->m_testCtx;
        node = (TestNode *)operator_new(0x90);
        tcu::TestCase::TestCase
                  ((TestCase *)node,testCtx_00,NODETYPE_SELF_VALIDATE,(char *)local_1c8,
                   (char *)local_1a8[0]);
        node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d2ec50;
        node[1]._vptr_TestNode = (_func_int **)anon_unknown_2::initPrograms;
        node[1].m_testCtx = (TestContext *)anon_unknown_2::test;
        node[1].m_name._M_dataplus._M_p = pcVar5;
        *(int *)&node[1].m_name._M_string_length = (int)local_1e8;
        tcu::TestNode::addChild(local_1f0,node);
        if (local_1a8[0] != local_198) {
          operator_delete(local_1a8[0],local_198[0] + 1);
        }
        if (local_1c8 != local_1b8) {
          operator_delete(local_1c8,local_1b8[0] + 1);
        }
        lVar4 = lVar4 + 1;
        pcVar5 = pcVar5 + 0x100000000;
      } while (lVar4 != 3);
      iVar3 = (int)local_1e8;
      local_1e8 = (ulong)(iVar3 + 1);
    } while (iVar3 == 0);
    lVar4 = local_1e0 + 1;
  } while (local_1e0 == 0);
  return (TestCaseGroup *)local_1f0;
}

Assistant:

tcu::TestCaseGroup* createCommonEdgeTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> group (new tcu::TestCaseGroup(testCtx, "common_edge", "Draw multiple adjacent shapes and check that no cracks appear between them"));

	static const TessPrimitiveType primitiveTypes[] =
	{
		TESSPRIMITIVETYPE_TRIANGLES,
		TESSPRIMITIVETYPE_QUADS,
	};

	for (int primitiveTypeNdx = 0; primitiveTypeNdx < DE_LENGTH_OF_ARRAY(primitiveTypes); ++primitiveTypeNdx)
	for (int caseTypeNdx = 0; caseTypeNdx < CASETYPE_LAST; ++caseTypeNdx)
	for (int spacingModeNdx = 0; spacingModeNdx < SPACINGMODE_LAST; ++spacingModeNdx)
	{
		const TessPrimitiveType primitiveType = primitiveTypes[primitiveTypeNdx];
		const CaseType			caseType	  = static_cast<CaseType>(caseTypeNdx);
		const SpacingMode		spacingMode   = static_cast<SpacingMode>(spacingModeNdx);
		const CaseDefinition	caseDef		  = { primitiveType, spacingMode, caseType };

		addFunctionCaseWithPrograms(group.get(), getCaseName(primitiveType, spacingMode, caseType), "", initPrograms, test, caseDef);
	}

	return group.release();
}